

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.h
# Opt level: O1

IntResult * __thiscall
slang::parsing::NumberParser::parseInteger<slang::parsing::Preprocessor,true>
          (IntResult *__return_storage_ptr__,NumberParser *this,Preprocessor *stream)

{
  bool bVar1;
  uint uVar2;
  SourceLocation SVar3;
  Info *pIVar4;
  ulong uVar6;
  int iVar9;
  Token sizeToken;
  Token baseToken;
  Token TVar10;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar11;
  Token TVar12;
  Token first;
  Token local_c8;
  Token local_b8;
  Token local_a8;
  Token local_98;
  Token local_88;
  Token local_78;
  Token local_60;
  Token local_50;
  Token local_40;
  undefined8 uVar5;
  undefined8 uVar7;
  Info *pIVar8;
  
  uVar6 = (ulong)(stream->lastConsumed).kind;
  Token::Token(&local_b8);
  Token::Token(&local_c8);
  TVar10 = Preprocessor::consume(stream);
  local_88._0_8_ = uVar6;
  if (TVar10.kind == IntegerBase) {
    local_c8 = TVar10;
    Token::Token(&local_40);
  }
  else {
    bVar1 = Preprocessor::peekSameLine(stream);
    if ((!bVar1) || (TVar12 = Preprocessor::peek(stream), TVar12.kind != IntegerBase)) {
      checkIntOverflow(this,TVar10);
      Token::Token(&__return_storage_ptr__->size);
      Token::Token(&__return_storage_ptr__->base);
      __return_storage_ptr__->value = TVar10;
      __return_storage_ptr__->isSimple = true;
      return __return_storage_ptr__;
    }
    local_b8 = TVar10;
    TVar10 = Preprocessor::consume(stream);
    local_40._0_8_ = local_b8._0_8_;
    local_40.info = local_b8.info;
    local_c8 = TVar10;
  }
  TVar12.info = local_40.info;
  TVar12.kind = local_40.kind;
  TVar12._2_1_ = local_40._2_1_;
  TVar12.numFlags.raw = local_40.numFlags.raw;
  TVar12.rawLen = local_40.rawLen;
  startVector(this,TVar10,TVar12);
  bVar1 = Preprocessor::peekSameLine(stream);
  if (bVar1) {
    local_98 = Preprocessor::peek(stream);
    bVar1 = syntax::SyntaxFacts::isPossibleVectorDigit(local_98.kind);
    if (bVar1) {
      local_a8 = local_98;
      SVar3 = Token::location(&local_98);
      this->firstLocation = SVar3;
      iVar9 = 0;
      do {
        uVar2 = append(this,local_a8,iVar9 == 0);
        Preprocessor::consume(stream);
        TVar10 = local_a8;
        if ((int)uVar2 < 0) {
          iVar9 = iVar9 + 1;
          bVar1 = Preprocessor::peekSameLine(stream);
          if (!bVar1) goto LAB_00213283;
          local_a8 = Preprocessor::peek(stream);
          bVar1 = true;
        }
        else {
          local_60.kind = local_a8.kind;
          local_60._2_1_ = local_a8._2_1_;
          local_60.numFlags.raw = local_a8.numFlags.raw;
          local_60.rawLen = local_a8.rawLen;
          local_60.info = local_a8.info;
          local_a8 = TVar10;
          SVar3 = Token::location(&local_60);
          Preprocessor::addDiag
                    (stream,(DiagCode)0x80004,
                     (SourceLocation)((ulong)uVar2 * 0x10000000 + (long)SVar3));
          iVar9 = iVar9 + 2;
LAB_00213283:
          bVar1 = false;
        }
        if (!bVar1) {
LAB_002132a8:
          TVar12 = local_b8;
          TVar10 = local_c8;
          bVar1 = local_88._0_4_ == 0x23;
          local_88.kind = local_b8.kind;
          local_88._2_1_ = local_b8._2_1_;
          local_88.numFlags.raw = local_b8.numFlags.raw;
          local_88.rawLen = local_b8.rawLen;
          local_88.info = local_b8.info;
          local_78.kind = local_c8.kind;
          local_78._2_1_ = local_c8._2_1_;
          local_78.numFlags.raw = local_c8.numFlags.raw;
          local_78.rawLen = local_c8.rawLen;
          local_78.info = local_c8.info;
          local_c8 = TVar10;
          local_b8 = TVar12;
          TVar10 = finishValue(this,local_98,iVar9 == 1,bVar1);
          (__return_storage_ptr__->size).kind = local_88.kind;
          (__return_storage_ptr__->size).field_0x2 = local_88._2_1_;
          (__return_storage_ptr__->size).numFlags = (NumericTokenFlags)local_88.numFlags.raw;
          (__return_storage_ptr__->size).rawLen = local_88.rawLen;
          (__return_storage_ptr__->size).info = local_88.info;
          (__return_storage_ptr__->base).kind = local_78.kind;
          (__return_storage_ptr__->base).field_0x2 = local_78._2_1_;
          (__return_storage_ptr__->base).numFlags = (NumericTokenFlags)local_78.numFlags.raw;
          (__return_storage_ptr__->base).rawLen = local_78.rawLen;
          (__return_storage_ptr__->base).info = local_78.info;
          __return_storage_ptr__->value = TVar10;
          __return_storage_ptr__->isSimple = false;
          return __return_storage_ptr__;
        }
        bVar1 = syntax::SyntaxFacts::isPossibleVectorDigit(local_a8.kind);
        if ((!bVar1) ||
           (sVar11 = Token::trivia(&local_a8), sVar11._M_extent._M_extent_value._M_extent_value != 0
           )) goto LAB_002132a8;
      } while( true );
    }
    pIVar4 = local_b8.info;
    uVar5 = local_b8._0_8_;
    uVar7 = local_c8._0_8_;
    pIVar8 = local_c8.info;
    local_50._0_8_ = local_98._0_8_;
    local_50.info = local_98.info;
  }
  else {
    uVar5 = local_b8._0_8_;
    pIVar4 = local_b8.info;
    uVar7 = local_c8._0_8_;
    pIVar8 = local_c8.info;
    Token::Token(&local_50);
  }
  TVar10.info = local_50.info;
  TVar10.kind = local_50.kind;
  TVar10._2_1_ = local_50._2_1_;
  TVar10.numFlags.raw = local_50.numFlags.raw;
  TVar10.rawLen = local_50.rawLen;
  sizeToken.info = pIVar4;
  sizeToken.kind = (TokenKind)uVar5;
  sizeToken._2_1_ = SUB81(uVar5,2);
  sizeToken.numFlags.raw = SUB81(uVar5,3);
  sizeToken.rawLen = SUB84(uVar5,4);
  baseToken.info = pIVar8;
  baseToken.kind = (TokenKind)uVar7;
  baseToken._2_1_ = SUB81(uVar7,2);
  baseToken.numFlags.raw = SUB81(uVar7,3);
  baseToken.rawLen = SUB84(uVar7,4);
  reportMissingDigits(__return_storage_ptr__,this,sizeToken,baseToken,TVar10);
  return __return_storage_ptr__;
}

Assistant:

IntResult parseInteger(TStream& stream) {
        const bool isNegated = stream.getLastConsumed().kind == TokenKind::Minus;

        Token sizeToken;
        Token baseToken;

        auto token = stream.consume();
        if (token.kind == TokenKind::IntegerBase) {
            baseToken = token;
            startVector(baseToken, Token());
        }
        else {
            auto createSimple = [&] {
                checkIntOverflow(token);
                return IntResult::simple(token);
            };

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    return createSimple();
            }

            if (!stream.peek(TokenKind::IntegerBase))
                return createSimple();

            sizeToken = token;
            baseToken = stream.consume();
            startVector(baseToken, sizeToken);
        }

        if constexpr (RequireSameLine) {
            if (!stream.peekSameLine())
                return reportMissingDigits(sizeToken, baseToken, Token());
        }

        // At this point we expect to see vector digits, but they could be split out into other
        // token types because of hex literals.
        auto first = stream.peek();
        if (!syntax::SyntaxFacts::isPossibleVectorDigit(first.kind))
            return reportMissingDigits(sizeToken, baseToken, first);

        int count = 0;
        Token next = first;
        firstLocation = first.location();

        do {
            count++;
            int index = append(next, count == 1);
            stream.consume();

            if (index >= 0) {
                // This handles a really obnoxious case: 'h 3e+2
                // The second token is initially lexed as a real literal, but we need to split
                // it apart here now that we know it's a hex literal and put the remaining (new)
                // tokens back on the parser's stack.
                stream.handleExponentSplit(next, (size_t)index);

                // Bump the count so that we definitely take the modified raw text
                // instead of trying to use the initial token's raw directly.
                count++;
                break;
            }

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    break;
            }

            next = stream.peek();
        } while (syntax::SyntaxFacts::isPossibleVectorDigit(next.kind) && next.trivia().empty());

        return IntResult::vector(sizeToken, baseToken, finishValue(first, count == 1, isNegated));
    }